

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

op_t * mem_to_address(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t mem,int reg_p)

{
  MIR_context_t ctx;
  MIR_reg_t reg;
  int64_t i;
  undefined8 uVar1;
  op_t oVar2;
  MIR_insn_t_conflict pMVar3;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined6 uStack_268;
  undefined2 uStack_262;
  undefined6 uStack_260;
  undefined2 uStack_25a;
  undefined6 uStack_258;
  op_t local_238;
  int64_t local_1f0;
  ushort uStack_1e0;
  
  oVar2 = mem;
  if (mem.mir_op._8_1_ != '\n') {
    if (mem.mir_op._8_1_ != '\t') {
      __assert_fail("mem.mir_op.mode == MIR_OP_MEM",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x29e7,"op_t mem_to_address(c2m_ctx_t, op_t, int)");
    }
    if (reg_p != 0) {
      get_new_temp(&local_238,c2m_ctx,MIR_T_I64);
      uVar1 = CONCAT62(local_238._10_6_,local_238._8_2_);
      local_238._8_2_ = local_238.mir_op._8_2_;
      pMVar3 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
      emit_insn_opt(c2m_ctx,pMVar3);
      __return_storage_ptr__->decl = local_238.decl;
      *(undefined8 *)&__return_storage_ptr__->field_0x8 = uVar1;
      (__return_storage_ptr__->mir_op).data =
           (void *)CONCAT62(local_238.mir_op.data._2_6_,local_238.mir_op.data._0_2_);
      *(ushort *)&(__return_storage_ptr__->mir_op).field_0x8 = local_238.mir_op._8_2_ & 0xff | 0x300
      ;
      *(ulong *)&(__return_storage_ptr__->mir_op).field_0xa =
           CONCAT26(local_238.mir_op.u.reg._0_2_,local_238.mir_op._10_6_);
      *(ulong *)((long)&(__return_storage_ptr__->mir_op).u.str.len + 2) =
           CONCAT26(local_238.mir_op.u.mem.nonalias._0_2_,local_238.mir_op.u.i._2_6_);
      *(ulong *)((long)&(__return_storage_ptr__->mir_op).u.str.s + 2) =
           CONCAT26(local_238.mir_op.u.mem.base._0_2_,local_238.mir_op.u._10_6_);
      *(ulong *)((long)&(__return_storage_ptr__->mir_op).u + 0x12) =
           CONCAT26(local_238.mir_op.u.mem.disp._0_2_,local_238.mir_op.u._18_6_);
      (__return_storage_ptr__->mir_op).u.mem.disp =
           CONCAT62(local_238.mir_op.u.mem.disp._2_6_,local_238.mir_op.u.mem.disp._0_2_);
      return __return_storage_ptr__;
    }
    goto LAB_0017502e;
  }
  reg = mem.mir_op.u._16_4_;
  ctx = c2m_ctx->ctx;
  i = mem.mir_op.u._24_8_;
  if (reg == 0 && mem.mir_op.u.mem.index == 0) {
    if (reg_p == 0) {
      local_238.mir_op._8_2_ = 3;
      mem.mir_op.u.reg._0_1_ = mem.mir_op.u._24_1_;
      mem.mir_op.u.mem.scale = oVar2.mir_op.u._25_1_;
      mem.mir_op.u.reg._2_2_ = oVar2.mir_op.u._26_2_;
      mem.mir_op.u.mem.alias = oVar2.mir_op.u._28_4_;
    }
    else {
      get_new_temp(&local_238,c2m_ctx,MIR_T_I64);
      mem._10_6_ = local_238._10_6_;
      mem._8_2_ = local_238._8_2_;
      local_278 = CONCAT26(local_238.mir_op.u.reg._0_2_,local_238.mir_op._10_6_);
      uStack_270 = CONCAT26(local_238.mir_op.u.mem.nonalias._0_2_,local_238.mir_op.u.i._2_6_);
      uStack_268 = local_238.mir_op.u._10_6_;
      uStack_262 = local_238.mir_op.u.mem.base._0_2_;
      mem.mir_op.data = (void *)CONCAT62(local_238.mir_op.data._2_6_,local_238.mir_op.data._0_2_);
      uStack_260 = local_238.mir_op.u._18_6_;
      uStack_25a = local_238.mir_op.u.mem.disp._0_2_;
      uStack_258 = local_238.mir_op.u.mem.disp._2_6_;
      MIR_new_int_op(ctx,i);
      local_238._8_2_ = local_238.mir_op._8_2_;
      pMVar3 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
      emit_insn_opt(c2m_ctx,pMVar3);
      mem.decl = local_238.decl;
LAB_00175007:
      mem.mir_op._10_6_ = SUB86(local_278,0);
      mem.mir_op.u.reg._0_1_ = (undefined1)((ulong)local_278 >> 0x30);
      mem.mir_op.u.mem.scale = (MIR_scale_t)((ulong)local_278 >> 0x38);
      mem.mir_op.u.reg._2_2_ = (undefined2)uStack_270;
      mem.mir_op.u.mem.alias = (MIR_alias_t)((ulong)uStack_270 >> 0x10);
      mem.mir_op.u.mem.nonalias._0_2_ = (undefined2)((ulong)uStack_270 >> 0x30);
      mem.mir_op.u._10_6_ = uStack_268;
      mem.mir_op.u.mem.base._0_2_ = uStack_262;
      mem.mir_op.u.mem.base._2_2_ = (undefined2)uStack_260;
      mem.mir_op.u.mem.index = (MIR_reg_t)((uint6)uStack_260 >> 0x10);
      mem.mir_op.u.mem.disp._0_2_ = uStack_25a;
      mem.mir_op.u.mem.disp._2_6_ = uStack_258;
    }
  }
  else {
    if (i != 0 || mem.mir_op.u.mem.index != 0) {
      local_1f0 = i;
      if (mem.mir_op.u.mem.index == 0) {
        get_new_temp(&local_238,c2m_ctx,MIR_T_I64);
        mem.mir_op.data = (void *)CONCAT62(local_238.mir_op.data._2_6_,local_238.mir_op.data._0_2_);
        mem._10_6_ = local_238._10_6_;
        mem._8_2_ = local_238._8_2_;
        local_278 = CONCAT26(local_238.mir_op.u.reg._0_2_,local_238.mir_op._10_6_);
        uStack_270 = CONCAT26(local_238.mir_op.u.mem.nonalias._0_2_,local_238.mir_op.u.i._2_6_);
        uStack_268 = local_238.mir_op.u._10_6_;
        uStack_262 = local_238.mir_op.u.mem.base._0_2_;
        uStack_260 = local_238.mir_op.u._18_6_;
        uStack_25a = local_238.mir_op.u.mem.disp._0_2_;
        uStack_258 = local_238.mir_op.u.mem.disp._2_6_;
        MIR_new_reg_op(ctx,reg);
        MIR_new_int_op(ctx,local_1f0);
        local_238._8_2_ = local_238.mir_op._8_2_;
        pMVar3 = MIR_new_insn(c2m_ctx->ctx,MIR_ADD);
        emit_insn_opt(c2m_ctx,pMVar3);
        mem.decl = local_238.decl;
      }
      else {
        get_new_temp(&local_238,c2m_ctx,MIR_T_I64);
        mem.mir_op.data = (void *)CONCAT62(local_238.mir_op.data._2_6_,local_238.mir_op.data._0_2_);
        mem._10_6_ = local_238._10_6_;
        mem._8_2_ = local_238._8_2_;
        local_278 = CONCAT26(local_238.mir_op.u.reg._0_2_,local_238.mir_op._10_6_);
        uStack_270 = CONCAT26(local_238.mir_op.u.mem.nonalias._0_2_,local_238.mir_op.u.i._2_6_);
        uStack_268 = local_238.mir_op.u._10_6_;
        uStack_262 = local_238.mir_op.u.mem.base._0_2_;
        uStack_260 = local_238.mir_op.u._18_6_;
        uStack_25a = local_238.mir_op.u.mem.disp._0_2_;
        uStack_258 = local_238.mir_op.u.mem.disp._2_6_;
        if ((ulong)mem.mir_op.u.mem.scale == 1) {
          MIR_new_reg_op(ctx,mem.mir_op.u.mem.index);
          local_238._8_2_ = local_238.mir_op._8_2_;
          pMVar3 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
          emit_insn_opt(c2m_ctx,pMVar3);
        }
        else {
          MIR_new_reg_op(ctx,mem.mir_op.u.mem.index);
          MIR_new_int_op(ctx,(ulong)mem.mir_op.u.mem.scale);
          local_238._8_2_ = local_238.mir_op._8_2_;
          pMVar3 = MIR_new_insn(c2m_ctx->ctx,MIR_MUL);
          emit_insn_opt(c2m_ctx,pMVar3);
        }
        if (reg != 0) {
          MIR_new_reg_op(ctx,reg);
          local_238._8_2_ = local_238.mir_op._8_2_;
          uStack_1e0 = local_238.mir_op._8_2_;
          pMVar3 = MIR_new_insn(c2m_ctx->ctx,MIR_ADD);
          emit_insn_opt(c2m_ctx,pMVar3);
        }
        if (local_1f0 != 0) {
          MIR_new_int_op(ctx,local_1f0);
          local_238._8_2_ = local_238.mir_op._8_2_;
          uStack_1e0 = local_238.mir_op._8_2_;
          pMVar3 = MIR_new_insn(c2m_ctx->ctx,MIR_ADD);
          emit_insn_opt(c2m_ctx,pMVar3);
        }
        mem.decl = local_238.decl;
      }
      goto LAB_00175007;
    }
    mem.mir_op.u.reg._0_1_ = mem.mir_op.u._16_1_;
    mem.mir_op.u.mem.scale = oVar2.mir_op.u._17_1_;
    local_238.mir_op._8_2_ = 1;
    mem.mir_op.u.mem._2_2_ = mem.mir_op.u.mem.base._2_2_;
  }
  mem.mir_op._8_2_ = local_238.mir_op._8_2_ & 0xff | 0x300;
LAB_0017502e:
  __return_storage_ptr__->decl = mem.decl;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = mem._8_8_;
  (__return_storage_ptr__->mir_op).data = mem.mir_op.data;
  *(ulong *)&(__return_storage_ptr__->mir_op).field_0x8 =
       CONCAT62(mem.mir_op._10_6_,mem.mir_op._8_2_);
  (__return_storage_ptr__->mir_op).u.i =
       CONCAT44(mem.mir_op.u.mem.alias,
                CONCAT22(mem.mir_op.u.reg._2_2_,
                         CONCAT11(mem.mir_op.u.mem.scale,mem.mir_op.u.reg._0_1_)));
  (__return_storage_ptr__->mir_op).u.str.s =
       (char *)CONCAT62(mem.mir_op.u._10_6_,mem.mir_op.u.mem.nonalias._0_2_);
  *(ulong *)((long)&(__return_storage_ptr__->mir_op).u + 0x10) =
       CONCAT44(mem.mir_op.u.mem.index,
                CONCAT22(mem.mir_op.u.mem.base._2_2_,mem.mir_op.u.mem.base._0_2_));
  (__return_storage_ptr__->mir_op).u.mem.disp =
       CONCAT62(mem.mir_op.u.mem.disp._2_6_,mem.mir_op.u.mem.disp._0_2_);
  return __return_storage_ptr__;
}

Assistant:

static op_t mem_to_address (c2m_ctx_t c2m_ctx, op_t mem, int reg_p) {
  MIR_context_t ctx = c2m_ctx->ctx;
  op_t temp;

  if (mem.mir_op.mode == MIR_OP_STR) {
    if (!reg_p) return mem;
    temp = get_new_temp (c2m_ctx, MIR_T_I64);
    emit2 (c2m_ctx, MIR_MOV, temp.mir_op, mem.mir_op);
    temp.mir_op.value_mode = MIR_OP_INT;
    return temp;
  }
  assert (mem.mir_op.mode == MIR_OP_MEM);
  if (mem.mir_op.u.mem.base == 0 && mem.mir_op.u.mem.index == 0) {
    if (!reg_p) {
      mem.mir_op.mode = MIR_OP_INT;
      mem.mir_op.u.i = mem.mir_op.u.mem.disp;
    } else {
      temp = get_new_temp (c2m_ctx, MIR_T_I64);
      emit2 (c2m_ctx, MIR_MOV, temp.mir_op, MIR_new_int_op (ctx, mem.mir_op.u.mem.disp));
      mem = temp;
    }
  } else if (mem.mir_op.u.mem.index == 0 && mem.mir_op.u.mem.disp == 0) {
    mem.mir_op.mode = MIR_OP_REG;
    mem.mir_op.u.reg = mem.mir_op.u.mem.base;
  } else if (mem.mir_op.u.mem.index == 0) {
    temp = get_new_temp (c2m_ctx, MIR_T_I64);
    emit3 (c2m_ctx, MIR_ADD, temp.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.base),
           MIR_new_int_op (ctx, mem.mir_op.u.mem.disp));
    mem = temp;
  } else {
    temp = get_new_temp (c2m_ctx, MIR_T_I64);
    if (mem.mir_op.u.mem.scale != 1)
      emit3 (c2m_ctx, MIR_MUL, temp.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.index),
             MIR_new_int_op (ctx, mem.mir_op.u.mem.scale));
    else
      emit2 (c2m_ctx, MIR_MOV, temp.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.index));
    if (mem.mir_op.u.mem.base != 0)
      emit3 (c2m_ctx, MIR_ADD, temp.mir_op, temp.mir_op,
             MIR_new_reg_op (ctx, mem.mir_op.u.mem.base));
    if (mem.mir_op.u.mem.disp != 0)
      emit3 (c2m_ctx, MIR_ADD, temp.mir_op, temp.mir_op,
             MIR_new_int_op (ctx, mem.mir_op.u.mem.disp));
    mem = temp;
  }
  mem.mir_op.value_mode = MIR_OP_INT;
  return mem;
}